

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_alloc_get(Integer datatype,Integer nelem,char *name,Integer *memhandle,
                    MA_AccessIndex *index)

{
  Boolean BVar1;
  Integer in_RCX;
  MA_AccessIndex *in_R8;
  Integer *unaff_retaddr;
  undefined8 local_8;
  
  ma_stats.calls[0] = ma_stats.calls[0] + 1;
  BVar1 = MA_allocate_heap((Integer)name,(Integer)memhandle,(char *)index,unaff_retaddr);
  if (BVar1 == 0) {
    local_8 = 0;
  }
  else {
    local_8 = MA_get_index(in_RCX,in_R8);
  }
  return local_8;
}

Assistant:

public Boolean MA_alloc_get(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle,    /* RETURN: handle for this block */
    MA_AccessIndex    *index  /* RETURN: index for this block */   )
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_alloc_get]++;
#endif /* STATS */

    if (MA_allocate_heap(datatype, nelem, name, memhandle))
        /* MA_allocate_heap succeeded; try MA_get_index */
        return MA_get_index(*memhandle, index);
    else
        /* MA_allocate_heap failed */
        return MA_FALSE;
}